

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O1

type __thiscall
boost::spirit::classic::
sequence<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,boost::spirit::classic::alternative<boost::spirit::classic::alternative<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<c...Format_Spirit::AddStartState>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessStartStateList>>>
::
parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
          (sequence<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,boost::spirit::classic::alternative<boost::spirit::classic::alternative<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<c___Format_Spirit::AddStartState>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessStartStateList>>>
           *this,scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
                 *scan)

{
  type tVar1;
  type tVar2;
  type tVar3;
  
  tVar1 = action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
          ::
          parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
                    ((action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>
                      *)this,scan);
  if (-1 < tVar1.len) {
    tVar2 = alternative<boost::spirit::classic::alternative<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::StartStateRowProbs>,boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::cl...PFormat_Spirit::AddStartState>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessStartStateList>>
            ::
            parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
                      ((alternative<boost::spirit::classic::alternative<boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::DebugOutput>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::StartStateRowProbs>,boost::spirit::classic::action<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::cl___PFormat_Spirit::AddStartState>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessStartStateList>>
                        *)(this + 0x28),scan);
    tVar3.len = 0;
    if (0 < tVar2.len) {
      tVar3 = tVar2;
    }
    if (-1 < tVar2.len) {
      return (type)(tVar3.len + tVar1.len);
    }
  }
  return (type)-1;
}

Assistant:

typename parser_result<self_t, ScannerT>::type
        parse(ScannerT const& scan) const
        {
            typedef typename parser_result<self_t, ScannerT>::type result_t;
            if (result_t ma = this->left().parse(scan))
                if (result_t mb = this->right().parse(scan))
                {
                    scan.concat_match(ma, mb);
                    return ma;
                }
            return scan.no_match();
        }